

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  simplex_t *psVar1;
  ulong uVar2;
  undefined1 idx [16];
  undefined1 index [16];
  undefined1 index_00 [16];
  bool bVar3;
  vertex_t vVar4;
  int iVar5;
  coefficient_t cVar6;
  long lVar7;
  long extraout_RDX;
  ulong uVar8;
  long extraout_RDX_00;
  long extraout_RDX_01;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar9;
  undefined8 in_stack_ffffffffffffff10;
  long lVar10;
  diameter_entry_t local_b8;
  simplex_t *local_98;
  simplex_t *local_88;
  uint local_70;
  uint local_6c;
  coefficient_t face_coefficient;
  coefficient_t modulus;
  long local_60;
  value_t local_4c;
  simplex_t *psStack_48;
  value_t face_diameter;
  long local_38;
  simplex_t face_index;
  undefined8 local_20;
  Simplex_boundary_enumerator *local_10;
  Simplex_boundary_enumerator *this_local;
  
  local_10 = this;
  bVar3 = has_next(this);
  if (bVar3) {
    face_index._8_8_ = (undefined8)this->idx_below;
    local_20 = *(undefined8 *)((long)&this->idx_below + 8);
    idx._4_4_ = in_stack_ffffffffffffff0c;
    idx._0_4_ = in_stack_ffffffffffffff08;
    idx._8_8_ = in_stack_ffffffffffffff10;
    vVar4 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::get_max_vertex
                      (this->simplex_encoding,(simplex_t)idx,(dimension_t)face_index._8_8_,
                       (vertex_t)local_20);
    this->j = vVar4;
    psVar1 = *(simplex_t **)&this->idx_above;
    lVar10 = *(long *)((long)&this->idx_above + 8);
    psStack_48 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                           ((simplex_t *)this->simplex_encoding,
                            (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                             *)(ulong)(uint)this->j,
                            (int)(char)((char)*(undefined4 *)&this->k + '\x01'),(dimension_t)lVar10)
    ;
    uVar8 = (long)psVar1 - (long)psStack_48;
    uVar2 = (ulong)this->idx_below;
    _face_coefficient = uVar8 + uVar2;
    local_60 = ((lVar10 - extraout_RDX) - (ulong)(psVar1 < psStack_48)) +
               *(long *)((long)&this->idx_below + 8) + (ulong)CARRY8(uVar8,uVar2);
    index._4_4_ = in_stack_ffffffffffffff0c;
    index._0_4_ = in_stack_ffffffffffffff08;
    index._8_8_ = lVar10;
    local_38 = _face_coefficient;
    face_index._0_8_ = local_60;
    local_4c = compute_diameter(this->parent,(simplex_t)index,(dimension_t)_face_coefficient);
    local_6c = this->parent->modulus;
    if ((this->k & 1U) == 0) {
      iVar5 = 1;
    }
    else {
      iVar5 = local_6c - 1;
    }
    iVar9 = iVar5;
    cVar6 = Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
            ::get_coefficient(this->parent,&this->simplex);
    local_70 = (iVar5 * cVar6) % local_6c;
    local_88 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                         ((simplex_t *)this->simplex_encoding,
                          (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                          (ulong)(uint)this->j,(int)(char)((char)*(undefined4 *)&this->k + '\x01'),
                          (dimension_t)local_6c);
    lVar7 = (*(long *)((long)&this->idx_below + 8) - extraout_RDX_00) -
            (ulong)(*(simplex_t **)&this->idx_below < local_88);
    *(long *)&this->idx_below = (long)*(simplex_t **)&this->idx_below - (long)local_88;
    *(long *)((long)&this->idx_below + 8) = lVar7;
    local_98 = Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                         ((simplex_t *)this->simplex_encoding,
                          (Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_> *)
                          (ulong)(uint)this->j,(int)this->k,(dimension_t)lVar7);
    uVar2 = (ulong)this->idx_above;
    lVar7 = *(long *)((long)&this->idx_above + 8);
    *(ulong *)&this->idx_above = uVar2 + (long)local_98;
    *(ulong *)((long)&this->idx_above + 8) =
         lVar7 + extraout_RDX_01 + (ulong)CARRY8(uVar2,(ulong)local_98);
    this->k = this->k + -1;
    index_00._4_4_ = iVar9;
    index_00._0_4_ = iVar5;
    index_00._8_8_ = lVar10;
    Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
    ::make_diameter_entry
              (&local_b8,this->parent,local_4c,(simplex_t)index_00,(coefficient_t)local_38);
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true>
              (__return_storage_ptr__,&local_b8);
  }
  else {
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }